

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names_internal.cc
# Opt level: O0

string * __thiscall
upb::generator::MiniTableHeaderFilename_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,string_view proto_filename,bool bootstrap)

{
  bool bVar1;
  string *psVar2;
  char *extraout_RDX;
  string_view fname;
  string_view filename;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  generator *local_58;
  size_t sStack_50;
  undefined1 local_48 [8];
  string base;
  bool bootstrap_local;
  string_view proto_filename_local;
  
  fname._M_len = proto_filename._M_len;
  base.field_2._M_local_buf[0xf] = (byte)proto_filename._M_str & 1;
  psVar2 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)local_48);
  if ((base.field_2._M_local_buf[0xf] & 1U) != 0) {
    filename._M_str = extraout_RDX;
    filename._M_len = fname._M_len;
    local_58 = this;
    sStack_50 = fname._M_len;
    bVar1 = IsDescriptorProto(this,filename);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)local_48,"upb/reflection/stage1/");
    }
    else {
      std::__cxx11::string::operator=((string *)local_48,"upb_generator/stage1/");
    }
  }
  fname._M_str = (char *)psVar2;
  StripExtension_abi_cxx11_(&local_a8,this,fname);
  std::operator+(&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_a8);
  std::operator+(__return_storage_ptr__,&local_88,".upb_minitable.h");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string MiniTableHeaderFilename(absl::string_view proto_filename,
                                    bool bootstrap) {
  std::string base;
  if (bootstrap) {
    if (IsDescriptorProto(proto_filename)) {
      base = "upb/reflection/stage1/";
    } else {
      base = "upb_generator/stage1/";
    }
  }
  return base + StripExtension(proto_filename) + ".upb_minitable.h";
}